

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>::dispose
          (Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase> *this)

{
  ForkHub<kj::Rc<kj::Refcounted>_> *obj;
  ForkHub<kj::Rc<kj::Refcounted>_> *ptrCopy;
  Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase> *this_local;
  
  obj = this->ptr;
  if (obj != (ForkHub<kj::Rc<kj::Refcounted>_> *)0x0) {
    this->ptr = (ForkHub<kj::Rc<kj::Refcounted>_> *)0x0;
    kj::_::ForkHubBase::dispose(&obj->super_ForkHubBase);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }